

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall gss::innards::Proof::initial_domain_is_empty(Proof *this,int p,string *where)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)
                           (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t,"* failure due to domain ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,p);
  poVar1 = std::operator<<(poVar1," being empty at ");
  poVar1 = std::operator<<(poVar1,(string *)where);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

auto Proof::initial_domain_is_empty(int p, const string & where) -> void
{
    *_imp->proof_stream << "* failure due to domain " << p << " being empty at " << where << '\n';
}